

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execChk<(moira::Instr)35,(moira::Mode)9,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  ushort in_SI;
  long *in_RDI;
  u32 dy;
  u32 data;
  u32 ea;
  i64 c;
  int dst;
  int src;
  int n;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  short sVar3;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = readOp<(moira::Mode)9,(moira::Size)2,128ul>
                    ((Moira *)(CONCAT44((int)(uint)in_SI >> 9,in_stack_ffffffffffffffe8) &
                              0x7ffffffff),(int)((ulong)in_RDI[0xb91] >> 0x20),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  sVar3 = (short)in_stack_ffffffffffffffd8;
  if (bVar1) {
    n = (int)((ulong)in_RDI >> 0x20);
    uVar2 = readD<(moira::Size)2>
                      ((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),n);
    (**(code **)(*in_RDI + 200))(in_RDI,6);
    bVar1 = ZERO<(moira::Size)2>((ulong)uVar2);
    *(bool *)((long)in_RDI + 0x5c9c) = bVar1;
    *(undefined1 *)((long)in_RDI + 0x5c9d) = 0;
    *(undefined1 *)((long)in_RDI + 0x5c9e) = 0;
    *(undefined1 *)((long)in_RDI + 0x5c9b) = 0;
    if (sVar3 < (short)uVar2) {
      (**(code **)(*in_RDI + 200))(in_RDI,2);
      bVar1 = NBIT<(moira::Size)2>((ulong)uVar2);
      *(bool *)((long)in_RDI + 0x5c9b) = bVar1;
      execTrapException((Moira *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),n);
    }
    else if ((short)uVar2 < 0) {
      (**(code **)(*in_RDI + 200))(in_RDI,4);
      *(undefined1 *)((long)in_RDI + 0x5c9b) = 1;
      execTrapException((Moira *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),n);
    }
    else {
      prefetch<4ul>((Moira *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
    }
  }
  return;
}

Assistant:

void
Moira::execChk(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    i64 c = clock;
    u32 ea, data, dy;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    dy = readD<S>(dst);

    sync(6);

    reg.sr.z = ZERO<S>(dy);
    reg.sr.v = 0;
    reg.sr.c = 0;
    reg.sr.n = MIMIC_MUSASHI ? reg.sr.n : 0;

    if ((i16)dy > (i16)data) {

        sync(MIMIC_MUSASHI ? 10 - (int)(clock - c) : 2);
        reg.sr.n = NBIT<S>(dy);
        execTrapException(6);
        return;
    }

    if ((i16)dy < 0) {

        sync(MIMIC_MUSASHI ? 10 - (int)(clock - c) : 4);
        reg.sr.n = MIMIC_MUSASHI ? NBIT<S>(dy) : 1;
        execTrapException(6);
        return;
    }
    
    prefetch<POLLIPL>();
}